

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

int __thiscall OpenMD::OpenMDBitSet::nthOffBit(OpenMDBitSet *this,unsigned_long n)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ulong in_RSI;
  OpenMDBitSet *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> indices;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  int local_34;
  vector<int,_std::allocator<int>_> local_30;
  ulong local_18;
  int local_4;
  
  local_18 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c8182);
  iVar2 = firstOffBit((OpenMDBitSet *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  local_34 = iVar2;
  while (uVar1 = local_18, local_34 != -1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
               (value_type_conflict2 *)in_RDI);
    in_stack_ffffffffffffffa4 = nextOffBit(in_RDI,in_stack_ffffffffffffffa4);
    local_34 = in_stack_ffffffffffffffa4;
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_30);
  if (uVar1 < sVar3) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,local_18);
    local_4 = *pvVar4;
  }
  else {
    local_4 = -1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
  return local_4;
}

Assistant:

int OpenMDBitSet::nthOffBit(unsigned long int n) const {
    std::vector<int> indices;
    for (int i = firstOffBit(); i != -1; i = nextOffBit(i)) {
      indices.push_back(i);
    }

    if (n < indices.size()) return indices[n];
    return -1;
  }